

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpConnection.c
# Opt level: O2

void sbfTcpConnectionErrorQueueCb(sbfQueueItem item,void *closure)

{
  int *piVar1;
  
  sbfLog_log(*closure,0,"TCP connection %p %s error",closure,(long)closure + 0x22);
  if ((*(code **)((long)closure + 0xa0) != (code *)0x0) && (*(int *)((long)closure + 0xc0) == 0)) {
    (**(code **)((long)closure + 0xa0))(closure,*(undefined8 *)((long)closure + 0xa8));
  }
  LOCK();
  piVar1 = (int *)((long)closure + 0xc4);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    free(closure);
    return;
  }
  return;
}

Assistant:

static void
sbfTcpConnectionErrorQueueCb (sbfQueueItem item, void* closure)
{
    sbfTcpConnection tc = closure;

#ifndef WIN32
        sbfLog_debug (tc->mLog,
                      "TCP connection %p %s error",
                      tc,
                      tc->mPeer.sun.sun_path);
#else
        char             tmp[INET_ADDRSTRLEN];

        inet_ntop (AF_INET, &tc->mPeer.sin.sin_addr, tmp, sizeof tmp);
        sbfLog_debug (tc->mLog,
                      "TCP connection %p (%s:%hu) error",
                      tc,
                      tmp,
                      ntohs (tc->mPeer.sin.sin_port));
#endif

    if (tc->mErrorCb != NULL && !tc->mDestroyed)
        tc->mErrorCb (tc, tc->mClosure);

    if (sbfRefCount_decrement (&tc->mRefCount))
        free (tc);
}